

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioBrokerServer.cpp
# Opt level: O1

void __thiscall helics::apps::AsioBrokerServer::stopServer(AsioBrokerServer *this)

{
  int iVar1;
  string_view message;
  string_view message_00;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->threadGuard);
  if (iVar1 == 0) {
    if (this->tcp_enabled_ == true) {
      message._M_str = "stopping tcp broker server";
      message._M_len = 0x1a;
      iVar1 = 0x424f1a;
      TypedBrokerServer::logMessage(message);
      gmlc::networking::TcpServer::close
                ((this->tcpserver).
                 super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 iVar1);
    }
    if (this->udp_enabled_ == true) {
      message_00._M_str = "stopping udp broker server";
      message_00._M_len = 0x1a;
      TypedBrokerServer::logMessage(message_00);
      ::asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::cancel
                (&(((this->udpserver).
                    super___shared_ptr<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  mSocket).super_basic_socket<asio::ip::udp,_asio::any_io_executor>);
    }
    std::thread::join();
    pthread_mutex_unlock((pthread_mutex_t *)&this->threadGuard);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void AsioBrokerServer::stopServer()
    {
        std::lock_guard<std::mutex> tlock(threadGuard);
        if (tcp_enabled_) {
#ifdef HELICS_ENABLE_TCP_CORE
            logMessage("stopping tcp broker server");
            tcpserver->close();
#endif
        }
        if (udp_enabled_) {
#ifdef HELICS_ENABLE_UDP_CORE
            logMessage("stopping udp broker server");
            udpserver->stop_receive();
#endif
        }
        mainLoopThread.join();
    }